

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O2

int TIFFWriteDirectoryTagSampleformatArray
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,uint32_t count,double *value)

{
  double dVar1;
  uint16_t uVar2;
  ushort uVar3;
  int iVar4;
  float *value_00;
  undefined1 uVar5;
  undefined2 uVar6;
  undefined1 uVar7;
  undefined2 uVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  
  uVar10 = (ulong)count;
  value_00 = (float *)_TIFFmallocExt(tif,uVar10 * 8);
  if (value_00 == (float *)0x0) {
    iVar4 = 0;
    TIFFErrorExtR(tif,"TIFFWriteDirectoryTagSampleformatArray","Out of memory");
  }
  else {
    uVar2 = (tif->tif_dir).td_sampleformat;
    if (uVar2 == 1) {
      uVar3 = (tif->tif_dir).td_bitspersample;
      if (uVar3 < 9) {
        for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
          dVar1 = value[uVar9];
          if (0.0 <= dVar1) {
            uVar7 = (char)(int)dVar1;
            if (NAN(dVar1)) {
              uVar7 = 0xff;
            }
            uVar5 = 0xff;
            if (dVar1 <= 255.0) {
              uVar5 = uVar7;
            }
          }
          else {
            uVar5 = 0;
          }
          *(undefined1 *)((long)value_00 + uVar9) = uVar5;
        }
        iVar4 = TIFFWriteDirectoryTagByteArray(tif,ndir,dir,tag,count,(uint8_t *)value_00);
      }
      else if (uVar3 < 0x11) {
        for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
          dVar1 = value[uVar9];
          if (0.0 <= dVar1) {
            uVar8 = (short)(int)dVar1;
            if (NAN(dVar1)) {
              uVar8 = 0xffff;
            }
            uVar6 = 0xffff;
            if (dVar1 <= 65535.0) {
              uVar6 = uVar8;
            }
          }
          else {
            uVar6 = 0;
          }
          *(undefined2 *)((long)value_00 + uVar9 * 2) = uVar6;
        }
        iVar4 = TIFFWriteDirectoryTagShortArray(tif,ndir,dir,tag,count,(uint16_t *)value_00);
      }
      else {
        for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
          dVar1 = value[uVar9];
          fVar11 = 0.0;
          if (0.0 <= dVar1) {
            fVar11 = (float)(long)dVar1;
            if (NAN(dVar1)) {
              fVar11 = -NAN;
            }
            if (4294967295.0 < dVar1) {
              fVar11 = -NAN;
            }
          }
          value_00[uVar9] = fVar11;
        }
        iVar4 = TIFFWriteDirectoryTagLongArray(tif,ndir,dir,tag,count,(uint32_t *)value_00);
      }
    }
    else if (uVar2 == 2) {
      uVar3 = (tif->tif_dir).td_bitspersample;
      if (uVar3 < 9) {
        for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
          dVar1 = value[uVar9];
          uVar7 = 0x7f;
          if (dVar1 <= 127.0) {
            uVar7 = (char)(int)dVar1;
            if (NAN(dVar1)) {
              uVar7 = 0x80;
            }
            if (dVar1 < -128.0) {
              uVar7 = 0x80;
            }
          }
          *(undefined1 *)((long)value_00 + uVar9) = uVar7;
        }
        iVar4 = TIFFWriteDirectoryTagSbyteArray(tif,ndir,dir,tag,count,(int8_t *)value_00);
      }
      else if (uVar3 < 0x11) {
        for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
          dVar1 = value[uVar9];
          uVar8 = 0x7fff;
          if (dVar1 <= 32767.0) {
            uVar8 = (short)(int)dVar1;
            if (NAN(dVar1)) {
              uVar8 = 0x8000;
            }
            if (dVar1 < -32768.0) {
              uVar8 = 0x8000;
            }
          }
          *(undefined2 *)((long)value_00 + uVar9 * 2) = uVar8;
        }
        iVar4 = TIFFWriteDirectoryTagSshortArray(tif,ndir,dir,tag,count,(int16_t *)value_00);
      }
      else {
        for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
          dVar1 = value[uVar9];
          fVar11 = NAN;
          if (dVar1 <= 2147483647.0) {
            fVar11 = (float)(int)dVar1;
            if (NAN(dVar1)) {
              fVar11 = -0.0;
            }
            if (dVar1 < -2147483648.0) {
              fVar11 = -0.0;
            }
          }
          value_00[uVar9] = fVar11;
        }
        iVar4 = TIFFWriteDirectoryTagSlongArray(tif,ndir,dir,tag,count,(int32_t *)value_00);
      }
    }
    else {
      iVar4 = 0;
      if (uVar2 == 3) {
        if ((tif->tif_dir).td_bitspersample < 0x21) {
          for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
            fVar11 = _TIFFClampDoubleToFloat(value[uVar9]);
            value_00[uVar9] = fVar11;
          }
          iVar4 = TIFFWriteDirectoryTagFloatArray(tif,ndir,dir,tag,count,value_00);
        }
        else {
          iVar4 = TIFFWriteDirectoryTagDoubleArray(tif,ndir,dir,tag,count,value);
        }
      }
    }
    _TIFFfreeExt(tif,value_00);
  }
  return iVar4;
}

Assistant:

static int TIFFWriteDirectoryTagSampleformatArray(TIFF *tif, uint32_t *ndir,
                                                  TIFFDirEntry *dir,
                                                  uint16_t tag, uint32_t count,
                                                  double *value)
{
    static const char module[] = "TIFFWriteDirectoryTagSampleformatArray";
    void *conv;
    uint32_t i;
    int ok;
    conv = _TIFFmallocExt(tif, count * sizeof(double));
    if (conv == NULL)
    {
        TIFFErrorExtR(tif, module, "Out of memory");
        return (0);
    }

    switch (tif->tif_dir.td_sampleformat)
    {
        case SAMPLEFORMAT_IEEEFP:
            if (tif->tif_dir.td_bitspersample <= 32)
            {
                for (i = 0; i < count; ++i)
                    ((float *)conv)[i] = _TIFFClampDoubleToFloat(value[i]);
                ok = TIFFWriteDirectoryTagFloatArray(tif, ndir, dir, tag, count,
                                                     (float *)conv);
            }
            else
            {
                ok = TIFFWriteDirectoryTagDoubleArray(tif, ndir, dir, tag,
                                                      count, value);
            }
            break;
        case SAMPLEFORMAT_INT:
            if (tif->tif_dir.td_bitspersample <= 8)
            {
                for (i = 0; i < count; ++i)
                    ((int8_t *)conv)[i] = TIFFClampDoubleToInt8(value[i]);
                ok = TIFFWriteDirectoryTagSbyteArray(tif, ndir, dir, tag, count,
                                                     (int8_t *)conv);
            }
            else if (tif->tif_dir.td_bitspersample <= 16)
            {
                for (i = 0; i < count; ++i)
                    ((int16_t *)conv)[i] = TIFFClampDoubleToInt16(value[i]);
                ok = TIFFWriteDirectoryTagSshortArray(tif, ndir, dir, tag,
                                                      count, (int16_t *)conv);
            }
            else
            {
                for (i = 0; i < count; ++i)
                    ((int32_t *)conv)[i] = TIFFClampDoubleToInt32(value[i]);
                ok = TIFFWriteDirectoryTagSlongArray(tif, ndir, dir, tag, count,
                                                     (int32_t *)conv);
            }
            break;
        case SAMPLEFORMAT_UINT:
            if (tif->tif_dir.td_bitspersample <= 8)
            {
                for (i = 0; i < count; ++i)
                    ((uint8_t *)conv)[i] = TIFFClampDoubleToUInt8(value[i]);
                ok = TIFFWriteDirectoryTagByteArray(tif, ndir, dir, tag, count,
                                                    (uint8_t *)conv);
            }
            else if (tif->tif_dir.td_bitspersample <= 16)
            {
                for (i = 0; i < count; ++i)
                    ((uint16_t *)conv)[i] = TIFFClampDoubleToUInt16(value[i]);
                ok = TIFFWriteDirectoryTagShortArray(tif, ndir, dir, tag, count,
                                                     (uint16_t *)conv);
            }
            else
            {
                for (i = 0; i < count; ++i)
                    ((uint32_t *)conv)[i] = TIFFClampDoubleToUInt32(value[i]);
                ok = TIFFWriteDirectoryTagLongArray(tif, ndir, dir, tag, count,
                                                    (uint32_t *)conv);
            }
            break;
        default:
            ok = 0;
    }

    _TIFFfreeExt(tif, conv);
    return (ok);
}